

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall
wallet::CWallet::AddToWalletIfInvolvingMe
          (CWallet *this,CTransactionRef *ptx,SyncTxState *state,bool fUpdate,
          bool rescanning_old_block)

{
  byte bVar1;
  CTransaction *tx;
  pointer pCVar2;
  pointer pCVar3;
  size_type sVar4;
  bool bVar5;
  ushort uVar6;
  optional<bool> oVar7;
  isminetype iVar8;
  const_iterator cVar9;
  CAmount CVar10;
  const_iterator cVar11;
  _Rb_tree_node_base *p_Var12;
  CWalletTx *pCVar13;
  runtime_error *this_00;
  pointer pCVar14;
  CTxOut *txout;
  pointer __k;
  _Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> __tmp;
  _Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> _Var15;
  _Alloc_hider __k_00;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  CTransactionRef tx_00;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar18;
  TxState tx_state;
  undefined1 rescanning_old_block_00;
  uint *in_stack_fffffffffffffed8;
  _Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> local_f8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [48];
  _Storage<wallet::AddressPurpose,_true> local_98;
  uchar auStack_94 [12];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_78;
  undefined1 local_58 [40];
  
  local_58._32_8_ = *(long *)(in_FS_OFFSET + 0x28);
  tx = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((state->
      super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      ).
      super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      ._M_index == '\0') {
    __k = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start;
    pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (__k != pCVar2) {
      do {
        pVar18 = std::
                 _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 ::equal_range(&(this->mapTxSpends)._M_h,&__k->prevout);
        if ((__node_type *)
            pVar18.first.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
            _M_cur != pVar18.second.
                      super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur.
                      super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>) {
          do {
            local_f8 = pVar18.second.
                       super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur;
            _Var15 = pVar18.first.
                     super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur;
            auVar17[0] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x2c));
            auVar17[1] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x2d));
            auVar17[2] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x2e));
            auVar17[3] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x2f));
            auVar17[4] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x30));
            auVar17[5] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x31));
            auVar17[6] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x32));
            auVar17[7] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x33));
            auVar17[8] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x34));
            auVar17[9] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x35));
            auVar17[10] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                           *(uchar *)((long)_Var15.
                                            super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                            ._M_cur + 0x36));
            auVar17[0xb] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                            *(uchar *)((long)_Var15.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x37));
            auVar17[0xc] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                            *(uchar *)((long)_Var15.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x38));
            auVar17[0xd] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                            *(uchar *)((long)_Var15.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x39));
            auVar17[0xe] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                            *(uchar *)((long)_Var15.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x3a));
            auVar17[0xf] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                            *(uchar *)((long)_Var15.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x3b));
            auVar16[0] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x3c));
            auVar16[1] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x3d));
            auVar16[2] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x3e));
            auVar16[3] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x3f));
            auVar16[4] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x40));
            auVar16[5] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x41));
            auVar16[6] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x42));
            auVar16[7] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x43));
            auVar16[8] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x44));
            auVar16[9] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                          *(uchar *)((long)_Var15.
                                           super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                           ._M_cur + 0x45));
            auVar16[10] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                           *(uchar *)((long)_Var15.
                                            super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                            ._M_cur + 0x46));
            auVar16[0xb] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                            *(uchar *)((long)_Var15.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x47));
            auVar16[0xc] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                            *(uchar *)((long)_Var15.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x48));
            auVar16[0xd] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                            *(uchar *)((long)_Var15.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x49));
            auVar16[0xe] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                            *(uchar *)((long)_Var15.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x4a));
            auVar16[0xf] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                            *(uchar *)((long)_Var15.
                                             super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                             ._M_cur + 0x4b));
            auVar16 = auVar16 & auVar17;
            if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) {
              base_blob<256u>::ToString_abi_cxx11_((string *)local_c8,&tx->hash);
              base_blob<256u>::ToString_abi_cxx11_((string *)local_58,state);
              base_blob<256u>::ToString_abi_cxx11_
                        (&local_78,
                         (uint256 *)
                         ((long)_Var15.
                                super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                ._M_cur + 0x2c));
              base_blob<256u>::ToString_abi_cxx11_
                        ((string *)&local_98,
                         (long *)((long)_Var15.
                                        super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                        ._M_cur + 8));
              in_stack_fffffffffffffed8 =
                   (uint *)((long)_Var15.
                                  super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                  ._M_cur + 0x28);
              WalletLogPrintf<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_int>
                        (this,(ConstevalFormatString<5U>)0x82e23e,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_58,&local_78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_98,in_stack_fffffffffffffed8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(auStack_94._0_4_,local_98._M_value) != &local_88) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(auStack_94._0_4_,local_98._M_value),
                                local_88._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
                operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
              }
              if ((undefined1 *)CONCAT44(local_c8._4_4_,local_c8._0_4_) != local_c8 + 0x10) {
                operator_delete((undefined1 *)CONCAT44(local_c8._4_4_,local_c8._0_4_),
                                local_c8._16_8_ + 1);
              }
              MarkConflicted(this,(uint256 *)state,
                             *(int *)((long)&(state->
                                             super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                             ).
                                             super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                             .
                                             super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                             .
                                             super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                             .
                                             super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                             .
                                             super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                             ._M_u + 0x20),
                             (uint256 *)
                             ((long)_Var15.
                                    super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                    ._M_cur + 0x2c));
            }
            pVar18.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
            _M_cur = local_f8.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                     _M_cur;
            pVar18.first.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
            _M_cur = (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)
                     (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)
                     *_Var15.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                      _M_cur;
          } while ((_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)
                   *_Var15.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                    _M_cur !=
                   local_f8.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                   _M_cur);
        }
        __k = __k + 1;
      } while (__k != pCVar2);
    }
  }
  cVar9 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mapWallet)._M_h,&(tx->hash).m_wrapped);
  if (cVar9.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur ==
      (__node_type *)0x0 || fUpdate) {
    if (cVar9.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur ==
        (__node_type *)0x0) {
      pCVar3 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar14 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start; pCVar14 != pCVar3; pCVar14 = pCVar14 + 1) {
        iVar8 = IsMine(this,&pCVar14->scriptPubKey);
        if (iVar8 != ISMINE_NO) goto LAB_00510287;
      }
      local_c8._0_4_ = 3;
      CVar10 = GetDebit(this,tx,(isminefilter *)local_c8);
      if (CVar10 < 1) goto LAB_005104df;
    }
LAB_00510287:
    rescanning_old_block_00 = SUB81(in_stack_fffffffffffffed8,0);
    pCVar14 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar3 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar14 != pCVar3) {
      do {
        GetScriptPubKeyMans((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                             *)local_c8,this,&pCVar14->scriptPubKey);
        for (p_Var12 = (_Rb_tree_node_base *)local_c8._24_8_;
            p_Var12 != (_Rb_tree_node_base *)(local_c8 + 8);
            p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
          (**(code **)(**(long **)(p_Var12 + 1) + 0x50))
                    (&local_78,*(long **)(p_Var12 + 1),&pCVar14->scriptPubKey);
          sVar4 = local_78._M_string_length;
          for (__k_00._M_p = local_78._M_dataplus._M_p; __k_00._M_p != (pointer)sVar4;
              __k_00._M_p = (pointer)((((key_type *)((uchar *)__k_00._M_p + 0x50))->
                                      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                      ).
                                      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                      .
                                      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                      .
                                      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                      .
                                      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                      .
                                      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                      ._M_u._M_first._M_storage._M_storage + 8)) {
            bVar1 = (((key_type *)((uchar *)__k_00._M_p + 0x50))->
                    super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    ).
                    super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    .
                    super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    .
                    super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    .
                    super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    .
                    super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    ._M_u._M_first._M_storage._M_storage[1];
            uVar6 = (ushort)bVar1;
            if (bVar1 == 0) {
              oVar7 = IsInternalScriptPubKeyMan(this,*(ScriptPubKeyMan **)(p_Var12 + 1));
              *(_Optional_base<bool,_true,_true> *)
               &(((key_type *)((uchar *)__k_00._M_p + 0x50))->
                super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                ).
                super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                .
                super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                .
                super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                .
                super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   = oVar7.super__Optional_base<bool,_true,_true>._M_payload.
                     super__Optional_payload_base<bool>;
              uVar6 = (ushort)oVar7.super__Optional_base<bool,_true,_true>._M_payload.
                              super__Optional_payload_base<bool> >> 8;
            }
            if ((((uVar6 & 1) != 0) &&
                (*(char *)&(((key_type *)((uchar *)__k_00._M_p + 0x50))->
                           super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           ).
                           super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           .
                           super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           .
                           super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           .
                           super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 == '\0')) &&
               ((cVar11 = std::
                          _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
                          ::find(&(this->m_address_book)._M_t,(key_type *)__k_00._M_p),
                (_Rb_tree_header *)cVar11._M_node ==
                &(this->m_address_book)._M_t._M_impl.super__Rb_tree_header ||
                (*(char *)&cVar11._M_node[4]._M_left == '\0')))) {
              local_58._0_8_ = local_58 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
              local_98._M_value = RECEIVE;
              auStack_94[0] = '\x01';
              SetAddressBook(this,(CTxDestination *)__k_00._M_p,(string *)local_58,
                             (optional<wallet::AddressPurpose> *)&local_98);
              if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
                operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
              }
            }
          }
          std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>::
          ~vector((vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> *)
                  &local_78);
        }
        std::
        _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
        ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                     *)local_c8);
        rescanning_old_block_00 = SUB81(in_stack_fffffffffffffed8,0);
        pCVar14 = pCVar14 + 1;
      } while (pCVar14 != pCVar3);
    }
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp:1279:43)_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>_&>
      ::_S_vtable._M_arr
      [(state->
       super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       ).
       super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       ._M_index]._M_data)
              ((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                *)local_c8,(anon_class_1_0_00000001 *)local_58,state);
    local_d8._0_8_ = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CTransaction_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),
               (CTransaction **)local_d8,(allocator<CTransaction> *)local_58,tx);
    local_58._16_16_ = (undefined1  [16])0x0;
    local_58._0_16_ = (undefined1  [16])0x0;
    tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8;
    tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_d8;
    pCVar13 = AddToWallet(this,tx_00,(TxState *)local_58,(UpdateWalletTxFn *)0x0,
                          rescanning_old_block,(bool)rescanning_old_block_00);
    if ((code *)local_58._16_8_ != (code *)0x0) {
      (*(code *)local_58._16_8_)(local_58,local_58,3);
    }
    if ((pointer)local_d8._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    if (pCVar13 == (CWalletTx *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"DB error adding transaction to wallet, write failed");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_58._32_8_) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_005106e2;
    }
    bVar5 = true;
  }
  else {
LAB_005104df:
    bVar5 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_58._32_8_) {
    return bVar5;
  }
LAB_005106e2:
  __stack_chk_fail();
}

Assistant:

bool CWallet::AddToWalletIfInvolvingMe(const CTransactionRef& ptx, const SyncTxState& state, bool fUpdate, bool rescanning_old_block)
{
    const CTransaction& tx = *ptx;
    {
        AssertLockHeld(cs_wallet);

        if (auto* conf = std::get_if<TxStateConfirmed>(&state)) {
            for (const CTxIn& txin : tx.vin) {
                std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range = mapTxSpends.equal_range(txin.prevout);
                while (range.first != range.second) {
                    if (range.first->second != tx.GetHash()) {
                        WalletLogPrintf("Transaction %s (in block %s) conflicts with wallet transaction %s (both spend %s:%i)\n", tx.GetHash().ToString(), conf->confirmed_block_hash.ToString(), range.first->second.ToString(), range.first->first.hash.ToString(), range.first->first.n);
                        MarkConflicted(conf->confirmed_block_hash, conf->confirmed_block_height, range.first->second);
                    }
                    range.first++;
                }
            }
        }

        bool fExisted = mapWallet.count(tx.GetHash()) != 0;
        if (fExisted && !fUpdate) return false;
        if (fExisted || IsMine(tx) || IsFromMe(tx))
        {
            /* Check if any keys in the wallet keypool that were supposed to be unused
             * have appeared in a new transaction. If so, remove those keys from the keypool.
             * This can happen when restoring an old wallet backup that does not contain
             * the mostly recently created transactions from newer versions of the wallet.
             */

            // loop though all outputs
            for (const CTxOut& txout: tx.vout) {
                for (const auto& spk_man : GetScriptPubKeyMans(txout.scriptPubKey)) {
                    for (auto &dest : spk_man->MarkUnusedAddresses(txout.scriptPubKey)) {
                        // If internal flag is not defined try to infer it from the ScriptPubKeyMan
                        if (!dest.internal.has_value()) {
                            dest.internal = IsInternalScriptPubKeyMan(spk_man);
                        }

                        // skip if can't determine whether it's a receiving address or not
                        if (!dest.internal.has_value()) continue;

                        // If this is a receiving address and it's not in the address book yet
                        // (e.g. it wasn't generated on this node or we're restoring from backup)
                        // add it to the address book for proper transaction accounting
                        if (!*dest.internal && !FindAddressBookEntry(dest.dest, /* allow_change= */ false)) {
                            SetAddressBook(dest.dest, "", AddressPurpose::RECEIVE);
                        }
                    }
                }
            }

            // Block disconnection override an abandoned tx as unconfirmed
            // which means user may have to call abandontransaction again
            TxState tx_state = std::visit([](auto&& s) -> TxState { return s; }, state);
            CWalletTx* wtx = AddToWallet(MakeTransactionRef(tx), tx_state, /*update_wtx=*/nullptr, /*fFlushOnClose=*/false, rescanning_old_block);
            if (!wtx) {
                // Can only be nullptr if there was a db write error (missing db, read-only db or a db engine internal writing error).
                // As we only store arriving transaction in this process, and we don't want an inconsistent state, let's throw an error.
                throw std::runtime_error("DB error adding transaction to wallet, write failed");
            }
            return true;
        }
    }
    return false;
}